

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::Property::Property(Property *this,Relationship *r,bool custom)

{
  ListEditQual qual;
  bool custom_local;
  Relationship *r_local;
  Property *this_local;
  
  Attribute::Attribute(&this->_attrib);
  this->_listOpQual = ResetToExplicit;
  this->_type = EmptyAttrib;
  Relationship::Relationship(&this->_rel,r);
  ::std::__cxx11::string::string((string *)&this->_prop_value_type_name);
  this->_has_custom = custom;
  this->_type = Relation;
  qual = Relationship::get_listedit_qual(r);
  set_listedit_qual(this,qual);
  return;
}

Assistant:

Property(const Relationship &r, bool custom = false)
      : _rel(r), _has_custom(custom) {
    _type = Type::Relation;
    set_listedit_qual(r.get_listedit_qual());
  }